

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

void __thiscall Quest::Load(Quest *this)

{
  World *pWVar1;
  Action *pAVar2;
  int iVar3;
  mapped_type *this_00;
  Quest *this_01;
  iterator iVar4;
  _Base_ptr p_Var5;
  Validation_Error *pVVar6;
  runtime_error *this_02;
  string *__x;
  long lVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *info;
  _Base_ptr p_Var8;
  Action *pAVar9;
  Rule *pRVar10;
  Action *pAVar11;
  Rule *pRVar12;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>
  __l_00;
  int local_a60 [19];
  allocator<char> local_a11;
  Rule *local_a10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_a08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  *local_a00;
  _Base_ptr local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  anon_class_16_2_f810ab82 check;
  string local_808;
  string local_7e8;
  Quest *local_7c8;
  _Base_ptr local_7c0;
  string filename;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  char namebuf [6];
  Action action;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_580;
  undefined1 local_558 [32];
  undefined1 local_538 [32];
  undefined1 local_518 [56];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_4b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_490;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_418;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
  local_288;
  string local_260 [32];
  undefined8 local_240;
  ifstream f;
  byte abStack_218 [488];
  
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&action,"QuestDir",(allocator<char> *)&f);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,(key_type *)&action);
  util::variant::GetString_abi_cxx11_(&filename,this_00);
  std::__cxx11::string::~string((string *)&action);
  sprintf(namebuf,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::append((char *)&filename);
  std::__cxx11::string::append((char *)&filename);
  std::ifstream::ifstream(&f,(string *)&filename,_S_in);
  if ((abStack_218[*(long *)(_f + -0x18)] & 5) != 0) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Failed to load quest");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = (Quest *)operator_new(0x68);
  EOPlus::Quest::Quest(this_01,(istream *)&f);
  this->quest = this_01;
  local_7c0 = &(this_01->states)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a00 = &local_580;
  local_a08 = &local_3f0;
  __x = &action.expr.function;
  p_Var5 = (this_01->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
          *)local_558;
  local_7c8 = this_01;
  do {
    local_9f8 = p_Var5;
    if (p_Var5 == local_7c0) {
      std::ifstream::~ifstream(&f);
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    if (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
        action_argument_info_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                                   ::action_argument_info_abi_cxx11_);
      if (iVar3 != 0) {
        local_738._M_dataplus._M_p._0_4_ = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action,(char (*) [9])"setstate",(int *)&local_738);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&action.cond_expr.scopes.
                           super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                           super__Deque_impl_data._M_start + 0x10),"reset",
                   (allocator<char> *)&local_9f0);
        action.cond_expr.scopes.super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
        local_798._M_dataplus._M_p = local_798._M_dataplus._M_p & 0xffffffff00000000;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.cond_expr.scopes.
                              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                              _M_impl.super__Deque_impl_data._M_finish + 0x18),
                   (char (*) [11])"resetdaily",(int *)&local_798);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&action.cond_expr.args,"end",(allocator<char> *)&local_9f0);
        action.cond_expr.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
        _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
        local_9f0._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.cond_expr.args.
                              super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                              _M_impl.super__Deque_impl_data._M_start + 0x18),
                   (char (*) [11])"startquest",(info_t *)&local_9f0);
        local_758._M_dataplus._M_p._0_4_ = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr,(char (*) [11])"resetquest",(int *)&local_758);
        check.name = (string *)CONCAT44(check.name._4_4_,2);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[14],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.expr.scopes.
                              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                              _M_impl.super__Deque_impl_data._M_start + 0x18),
                   (char (*) [14])"setqueststate",(int *)&check);
        local_a60[0x12] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.function,(char (*) [11])"addnpctext",local_a60 + 0x12);
        local_a60[0x11] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_map_size,(char (*) [12])"addnpcinput",
                   local_a60 + 0x11);
        local_a60[0x10] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_finish,(char (*) [11])"addnpcchat",local_a60 + 0x10
                  );
        local_a60[0xf] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(local_a00,(char (*) [9])"showhint",local_a60 + 0xf);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_558,"quake",(allocator<char> *)&local_808);
        local_538._0_4_ = 0;
        local_538._4_4_ = 1;
        local_808._M_dataplus._M_p = (pointer)0x100000000;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)(local_538 + 8),(char (*) [11])"quakeworld",(info_t *)&local_808);
        local_a60[0xe] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)(local_518 + 0x10),(char (*) [7])"setmap",local_a60 + 0xe);
        local_a60[0xd] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(&local_4e0,(char (*) [9])"setcoord",local_a60 + 0xd);
        local_a60[0xc] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(&local_4b8,(char (*) [10])"playsound",local_a60 + 0xc)
        ;
        local_a60[0xb] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_490,(char (*) [8])"giveexp",local_a60 + 0xb);
        local_7e8._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(&local_468,(char (*) [9])"giveitem",(info_t *)&local_7e8);
        local_778._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>
                  (&local_440,(char (*) [11])"removeitem",(info_t *)&local_778);
        local_a60[10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(&local_418,(char (*) [9])"setclass",local_a60 + 10);
        local_a60[9] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_3f0,(char (*) [8])"setrace",local_a60 + 9);
        local_a60[8] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(&local_3c8,(char (*) [12])"removekarma",local_a60 + 8)
        ;
        local_a60[7] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(&local_3a0,(char (*) [10])"givekarma",local_a60 + 7);
        local_a60[6] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(&local_378,(char (*) [9])"settitle",local_a60 + 6);
        local_a60[0] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(&local_350,(char (*) [10])"setfiance",local_a60);
        local_a60[5] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(&local_328,(char (*) [11])"setpartner",local_a60 + 5);
        local_a60[4] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_300,(char (*) [8])"sethome",local_a60 + 4);
        local_a60[3] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_2d8,(char (*) [8])"setstat",local_a60 + 3);
        local_a60[2] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(&local_2b0,(char (*) [9])"givestat",local_a60 + 2);
        local_a60[1] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>(&local_288,(char (*) [11])"removestat",local_a60 + 1);
        std::__cxx11::string::string<std::allocator<char>>(local_260,"roll",&local_a11);
        local_240 = 0x100000001;
        __l._M_len = 0x1f;
        __l._M_array = (iterator)&action;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
               *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                 ::action_argument_info_abi_cxx11_,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)p_Var5,(allocator_type *)info);
        lVar7 = 0x4b0;
        do {
          std::__cxx11::string::~string((string *)((long)&action.cond + lVar7));
          lVar7 = lVar7 + -0x28;
        } while (lVar7 != -0x28);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                     ::~map,validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::action_argument_info_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                             ::action_argument_info_abi_cxx11_);
      }
    }
    if (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
        rule_argument_info_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                                   ::rule_argument_info_abi_cxx11_);
      if (iVar3 != 0) {
        local_758._M_dataplus._M_p._0_4_ = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action,(char (*) [9])"inputnpc",(int *)&local_758);
        check.name = (string *)CONCAT44(check.name._4_4_,1);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.cond_expr.scopes.
                              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                              _M_impl.super__Deque_impl_data._M_start + 0x10),
                   (char (*) [12])"talkedtonpc",(int *)&check);
        local_a60[0x12] = 0;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.cond_expr.scopes.
                              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                              _M_impl.super__Deque_impl_data._M_finish + 0x18),
                   (char (*) [7])"always",local_a60 + 0x12);
        local_a60[0x11] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.cond_expr.args,(char (*) [10])"donedaily",local_a60 + 0x11);
        local_a60[0x10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.cond_expr.args.
                              super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                              _M_impl.super__Deque_impl_data._M_start + 0x18),
                   (char (*) [9])"entermap",local_a60 + 0x10);
        local_a60[0xf] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr,(char (*) [11])"entercoord",local_a60 + 0xf);
        local_a60[0xe] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)((long)&action.expr.scopes.
                              super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                              _M_impl.super__Deque_impl_data._M_start + 0x18),
                   (char (*) [9])"leavemap",local_a60 + 0xe);
        local_a60[0xd] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.function,(char (*) [11])"leavecoord",local_a60 + 0xd);
        local_9f0._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[11],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_map_size,(char (*) [11])"killednpcs",
                   (info_t *)&local_9f0);
        local_a60[0xc] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[14],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)&action.expr.args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_finish,(char (*) [14])"killedplayers",
                   local_a60 + 0xc);
        local_808._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(&local_580,(char (*) [9])"gotitems",(info_t *)&local_808);
        local_7e8._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)local_558,(char (*) [10])"lostitems",(info_t *)&local_7e8);
        local_778._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)(local_538 + 8),(char (*) [9])"useditem",(info_t *)&local_778);
        local_a60[0xb] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
                    *)(local_518 + 0x10),(char (*) [9])"isgender",local_a60 + 0xb);
        local_a60[10] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_4e0,(char (*) [8])"isclass",local_a60 + 10);
        local_a60[9] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>(&local_4b8,(char (*) [7])"israce",local_a60 + 9);
        local_a60[8] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(&local_490,(char (*) [10])"iswearing",local_a60 + 8);
        local_738._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_true>(&local_468,(char (*) [9])"gotspell",(info_t *)&local_738);
        local_a60[7] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(&local_440,(char (*) [10])"lostspell",local_a60 + 7);
        local_798._M_dataplus._M_p = (pointer)0x200000001;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_true>(&local_418,(char (*) [10])"usedspell",(info_t *)&local_798)
        ;
        local_a60[6] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[10],_int,_true>(local_a08,(char (*) [10])"citizenof",local_a60 + 6);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"rolled",(allocator<char> *)local_a60);
        local_3c8.second.min_args = 1;
        local_3c8.second.max_args = 2;
        local_a60[0] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[7],_int,_true>(&local_3a0,(char (*) [7])"statis",local_a60);
        local_a60[5] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_378,(char (*) [8])"statnot",local_a60 + 5);
        local_a60[4] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(&local_350,(char (*) [12])"statgreater",local_a60 + 4)
        ;
        local_a60[3] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[9],_int,_true>(&local_328,(char (*) [9])"statless",local_a60 + 3);
        local_a60[2] = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[12],_int,_true>(&local_300,(char (*) [12])"statbetween",local_a60 + 2)
        ;
        local_a60[1] = 1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
        ::pair<const_char_(&)[8],_int,_true>(&local_2d8,(char (*) [8])"statrpn",local_a60 + 1);
        __l_00._M_len = 0x1c;
        __l_00._M_array = (iterator)&action;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
               *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                 ::rule_argument_info_abi_cxx11_,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)p_Var5,(allocator_type *)info);
        lVar7 = 0x438;
        do {
          std::__cxx11::string::~string((string *)((long)&action.cond + lVar7));
          lVar7 = lVar7 + -0x28;
        } while (lVar7 != -0x28);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                     ::~map,validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                            ::rule_argument_info_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                             ::rule_argument_info_abi_cxx11_);
      }
    }
    p_Var5 = local_9f8 + 1;
    check.quest = local_7c8;
    pAVar11 = (Action *)local_9f8[7]._M_parent;
    pAVar9 = (Action *)local_9f8[7]._M_right;
    local_a10 = *(Rule **)(local_9f8 + 8);
    pAVar2 = (Action *)local_9f8[8]._M_parent;
    check.name = (string *)p_Var5;
    while (pAVar11 != pAVar2) {
      EOPlus::Action::Action(&action,pAVar11);
      iVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                      *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                        ::action_argument_info_abi_cxx11_,__x);
      if (iVar4._M_node ==
          (_Base_ptr)
          (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
           action_argument_info_abi_cxx11_ + 8)) {
        pVVar6 = (Validation_Error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_9f0,"Unknown action: ",__x);
        Validation_Error::Validation_Error(pVVar6,&local_9f0,(string *)p_Var5);
        __cxa_throw(pVVar6,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"Action",(allocator<char> *)&local_9f0);
      std::__cxx11::string::string((string *)&local_7e8,(string *)__x);
      info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
              *)(iVar4._M_node + 2);
      validate_state::anon_class_16_2_f810ab82::operator()
                (&check,&local_808,&local_7e8,&action.expr.args,(info_t *)info);
      std::__cxx11::string::~string((string *)&local_7e8);
      std::__cxx11::string::~string((string *)&local_808);
      EOPlus::Action::~Action(&action);
      pAVar11 = pAVar11 + 1;
      if (pAVar11 == pAVar9) {
        pAVar11 = *(Action **)((long)local_a10 + 8);
        local_a10 = (Rule *)((long)local_a10 + 8);
        pAVar9 = pAVar11 + 1;
      }
    }
    pRVar12 = (Rule *)local_9f8[4]._M_right;
    pRVar10 = (Rule *)local_9f8[5]._M_parent;
    p_Var8 = local_9f8[5]._M_left;
    local_a10 = (Rule *)local_9f8[5]._M_right;
    while (pRVar12 != local_a10) {
      EOPlus::Rule::Rule((Rule *)&action,pRVar12);
      iVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                      *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                        ::action_argument_info_abi_cxx11_,(key_type *)local_538);
      if (iVar4._M_node ==
          (_Base_ptr)
          (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
           action_argument_info_abi_cxx11_ + 8)) {
        pVVar6 = (Validation_Error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_9f0,"Unknown action: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_538);
        Validation_Error::Validation_Error(pVVar6,&local_9f0,(string *)p_Var5);
        __cxa_throw(pVVar6,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_778,"Action",(allocator<char> *)&local_9f0);
      std::__cxx11::string::string((string *)&local_738,(string *)local_538);
      info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
              *)(iVar4._M_node + 2);
      validate_state::anon_class_16_2_f810ab82::operator()
                (&check,&local_778,&local_738,
                 (deque<util::variant,_std::allocator<util::variant>_> *)local_518,(info_t *)info);
      std::__cxx11::string::~string((string *)&local_738);
      std::__cxx11::string::~string((string *)&local_778);
      EOPlus::Rule::~Rule((Rule *)&action);
      pRVar12 = pRVar12 + 1;
      if (pRVar12 == pRVar10) {
        pRVar12 = (Rule *)p_Var8->_M_parent;
        p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
        pRVar10 = pRVar12 + 1;
      }
    }
    pRVar12 = (Rule *)local_9f8[4]._M_right;
    pRVar10 = (Rule *)local_9f8[5]._M_parent;
    p_Var8 = local_9f8[5]._M_left;
    local_a10 = (Rule *)local_9f8[5]._M_right;
    while (pRVar12 != local_a10) {
      EOPlus::Rule::Rule((Rule *)&action,pRVar12);
      iVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>_>_>
                      *)validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)
                        ::rule_argument_info_abi_cxx11_,
                     (key_type *)
                     ((long)&action.cond_expr.scopes.
                             super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                             _M_impl.super__Deque_impl_data._M_finish + 0x18));
      if (iVar4._M_node ==
          (_Base_ptr)
          (validate_state(EOPlus::Quest_const&,std::__cxx11::string_const&,EOPlus::State_const&)::
           rule_argument_info_abi_cxx11_ + 8)) {
        pVVar6 = (Validation_Error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_9f0,"Unknown rule: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&action.cond_expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18));
        Validation_Error::Validation_Error(pVVar6,&local_9f0,(string *)p_Var5);
        __cxa_throw(pVVar6,&Validation_Error::typeinfo,Validation_Error::~Validation_Error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_798,"Rule",(allocator<char> *)&local_9f0);
      std::__cxx11::string::string
                ((string *)&local_758,
                 (string *)
                 ((long)&action.cond_expr.scopes.
                         super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
      info = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_info_t>
              *)(iVar4._M_node + 2);
      validate_state::anon_class_16_2_f810ab82::operator()
                (&check,&local_798,&local_758,
                 (deque<util::variant,_std::allocator<util::variant>_> *)
                 ((long)&action.cond_expr.function.field_2 + 8),(info_t *)info);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_798);
      EOPlus::Rule::~Rule((Rule *)&action);
      pRVar12 = pRVar12 + 1;
      if (pRVar12 == pRVar10) {
        pRVar12 = (Rule *)p_Var8->_M_parent;
        p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
        pRVar10 = pRVar12 + 1;
      }
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_9f8);
  } while( true );
}

Assistant:

void Quest::Load()
{
	char namebuf[6];

	std::string filename = this->world->config["QuestDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename += namebuf;
	filename += ".eqf";

	std::ifstream f(filename);

	if (!f)
		throw std::runtime_error("Failed to load quest");

	try
	{
		this->quest = new EOPlus::Quest(f);
		validate_quest(*this->quest);
	}
	catch (EOPlus::Syntax_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Syntax Error: %s (Line %i)", e.what(), e.line());
		throw;
	}
	catch (Validation_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Validation Error: %s (State: %s)", e.what(), e.state().c_str());
		throw;
	}
	catch (...)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		throw;
	}
}